

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ID.cpp
# Opt level: O2

ID * __thiscall ID_table_t::find(ID_table_t *this,string *id_name)

{
  ID *pIVar1;
  __type _Var2;
  ID *pIVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  pIVar3 = (this->table).super__Vector_base<ID,_std::allocator<ID>_>._M_impl.super__Vector_impl_data
           ._M_start;
  pIVar1 = (this->table).super__Vector_base<ID,_std::allocator<ID>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  while( true ) {
    if (pIVar3 == pIVar1) {
      return (ID *)0x0;
    }
    std::__cxx11::string::string((string *)&bStack_48,(string *)&pIVar3->name);
    _Var2 = std::operator==(id_name,&bStack_48);
    std::__cxx11::string::~string((string *)&bStack_48);
    if (_Var2) break;
    pIVar3 = pIVar3 + 1;
  }
  return pIVar3;
}

Assistant:

const ID* ID_table_t::find(const string id_name) const{
    vector<ID>::const_iterator ptr = table.cbegin();
    vector<ID>::const_iterator end  = table.cend();

    while(ptr != end){
        if(id_name == ptr->get_name())
            return &(*ptr);
        ++ptr;
    }
    return NULL;
}